

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExternref(WastParser *this,Const *const_)

{
  undefined8 uVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Location loc;
  bool bVar2;
  Result result_00;
  Literal *pLVar3;
  size_type sVar4;
  const_pointer pcVar5;
  undefined8 in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  uintptr_t uStack_178;
  Result result;
  uint64_t ref_bits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  iterator local_148;
  size_type local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  Token local_120;
  TokenType local_dc;
  undefined1 auStack_d8 [4];
  TokenType token_type;
  size_type sStack_d0;
  anon_union_16_2_ecfd7102_for_Location_1 local_c8;
  const_iterator local_b8;
  char *end;
  char *s;
  string_view sv;
  Literal literal;
  undefined1 local_60 [8];
  Token token;
  Const *const__local;
  WastParser *this_local;
  
  token.field_2.literal_.text.size_ = (size_type)const_;
  Consume((Token *)local_60,this);
  bVar2 = Features::reference_types_enabled(&this->options_->features);
  if (bVar2) {
    Literal::Literal((Literal *)&sv.size_);
    string_view::string_view((string_view *)&s);
    GetLocation((Location *)auStack_d8,this);
    ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
    (token.field_2.literal_.text.size_ + 0x10))->offset = (size_t)local_c8.field_1.offset;
    *(undefined8 *)(token.field_2.literal_.text.size_ + 0x18) = local_c8._8_8_;
    *(char **)token.field_2.literal_.text.size_ = _auStack_d8;
    *(size_type *)(token.field_2.literal_.text.size_ + 8) = sStack_d0;
    local_dc = Peek(this,0);
    if (local_dc == Int || local_dc == Last_Literal) {
      Consume(&local_120,this);
      pLVar3 = Token::literal(&local_120);
      sv.size_ = *(size_type *)pLVar3;
      s = (pLVar3->text).data_;
      sv.data_ = (char *)(pLVar3->text).size_;
      literal._0_8_ = s;
      literal.text.data_ = sv.data_;
      end = string_view::begin((string_view *)&s);
      local_b8 = string_view::end((string_view *)&s);
      result_00 = ParseInt64(end,local_b8,&stack0xfffffffffffffe88,UnsignedOnly);
      Const::set_externref((Const *)token.field_2.literal_.text.size_,uStack_178);
      bVar2 = Failed(result_00);
      if (bVar2) {
        uVar1 = *(undefined8 *)(token.field_2.literal_.text.size_ + 0x10);
        loc = *(Location *)token.field_2.literal_.text.size_;
        sVar4 = string_view::length((string_view *)&literal);
        pcVar5 = string_view::data((string_view *)&literal);
        Error(this,loc,"invalid literal \"%.*s\"",sVar4 & 0xffffffff,pcVar5,uVar1,in_R9);
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_168,"a numeric literal",(allocator *)((long)&ref_bits + 7));
      local_148 = &local_168;
      local_140 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&ref_bits + 6));
      __l._M_len = local_140;
      __l._M_array = local_148;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_138,__l,(allocator_type *)((long)&ref_bits + 6));
      this_local._4_4_ = ErrorExpected(this,&local_138,"123");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&ref_bits + 6));
      local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
      do {
        local_1b0 = local_1b0 + -1;
        std::__cxx11::string::~string((string *)local_1b0);
      } while (local_1b0 != &local_168);
      std::allocator<char>::~allocator((allocator<char> *)((long)&ref_bits + 7));
    }
  }
  else {
    literal.text.size_ = (size_type)local_60;
    Error(this,0x343f3f);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExternref(Const* const_) {
  WABT_TRACE(ParseExternref);
  Token token = Consume();
  if (!options_->features.reference_types_enabled()) {
    Error(token.loc, "externref not allowed");
    return Result::Error;
  }

  Literal literal;
  string_view sv;
  const char* s;
  const char* end;
  const_->loc = GetLocation();
  TokenType token_type = Peek();

  switch (token_type) {
    case TokenType::Nat:
    case TokenType::Int: {
      literal = Consume().literal();
      sv = literal.text;
      s = sv.begin();
      end = sv.end();
      break;
    }
    default:
      return ErrorExpected({"a numeric literal"}, "123");
  }

  uint64_t ref_bits;
  Result result = ParseInt64(s, end, &ref_bits, ParseIntType::UnsignedOnly);

  const_->set_externref(static_cast<uintptr_t>(ref_bits));

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}